

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.h
# Opt level: O2

uint8_t * __thiscall ZlibWriter::data(ZlibWriter *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  flush(this);
  puVar1 = (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = data::empty_byte;
  if ((this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    puVar2 = puVar1;
  }
  return puVar2;
}

Assistant:

inline const uint8_t * data() const
	{
		flush();
		if (zbuf.size() != 0)
		{
			return &zbuf[0];
		}
		else
		{
			static uint8_t empty_byte[1];
			return (const uint8_t *) &empty_byte;
		}
	}